

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [2],
          StringPtr *params_2,char (*params_3) [3],String *params_4)

{
  StringPtr *pSVar1;
  char (*value) [2];
  char (*value_00) [3];
  String *value_01;
  String *params_4_00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  String *params_local_4;
  char (*params_local_3) [3];
  StringPtr *params_local_2;
  char (*params_local_1) [2];
  StringPtr *params_local;
  
  params_4_00 = __return_storage_ptr__;
  local_38 = (String *)params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [2])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)this);
  local_48 = toCharSequence<kj::StringPtr&>(pSVar1);
  value = ::const((char (*) [2])params_local_2);
  local_58 = toCharSequence<char_const(&)[2]>(value);
  pSVar1 = fwd<kj::StringPtr_const&>((StringPtr *)params_local_3);
  local_68 = toCharSequence<kj::StringPtr_const&>(pSVar1);
  value_00 = ::const((char (*) [3])params_local_4);
  local_78 = toCharSequence<char_const(&)[3]>(value_00);
  value_01 = fwd<kj::String&>(local_38);
  local_88 = toCharSequence<kj::String&>(value_01);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}